

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O2

Result __thiscall
soplex::SPxMainSM<double>::removeEmpty(SPxMainSM<double> *this,SPxLPBase<double> *lp)

{
  shared_ptr<soplex::Tolerances> *psVar1;
  Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_> *this_00;
  VectorBase<double> *pVVar2;
  VectorBase<double> *pVVar3;
  double dVar4;
  int *piVar5;
  EmptyConstraintPS *this_01;
  double *pdVar6;
  FixBoundsPS *this_02;
  FixVariablePS *this_03;
  SPxOut *pSVar7;
  uint uVar8;
  int t;
  VectorBase<double> *pVVar9;
  double dVar10;
  double dVar11;
  int local_bc;
  shared_ptr<soplex::SPxMainSM<double>::PostStep> ptr;
  shared_ptr<soplex::SPxMainSM<double>::PostStep> ptr2;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  uVar8 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
  psVar1 = &(this->super_SPxSimplifier<double>)._tolerances;
  this_00 = &this->m_hist;
  local_bc = 0;
  do {
    do {
      if ((int)uVar8 < 1) {
        uVar8 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
        pVVar2 = &(lp->super_LPColSetBase<double>).low;
        pVVar3 = &(lp->super_LPColSetBase<double>).up;
        t = 0;
        goto LAB_001f3b01;
      }
      uVar8 = uVar8 - 1;
    } while ((lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem
             [(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[uVar8].idx].data.
             super_SVectorBase<double>.memused != 0);
    dVar4 = (lp->super_LPRowSetBase<double>).right.val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar8];
    dVar10 = feastol(this);
    if ((dVar4 < -dVar10) ||
       (dVar4 = (lp->super_LPRowSetBase<double>).left.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[uVar8], dVar10 = feastol(this), dVar10 < dVar4)) {
      return INFEASIBLE;
    }
    this_01 = (EmptyConstraintPS *)operator_new(0x38);
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_60,&psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
              );
    EmptyConstraintPS::EmptyConstraintPS
              (this_01,lp,uVar8,(shared_ptr<soplex::Tolerances> *)&local_60);
    std::__shared_ptr<soplex::SPxMainSM<double>::PostStep,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<soplex::SPxMainSM<double>::EmptyConstraintPS,void>
              ((__shared_ptr<soplex::SPxMainSM<double>::PostStep,(__gnu_cxx::_Lock_policy)2> *)&ptr,
               this_01);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
    std::
    vector<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>_>
    ::push_back(&this_00->data,(value_type *)&ptr);
    removeRow(this,lp,uVar8);
    local_bc = local_bc + 1;
    piVar5 = (this->m_stat).data;
    *piVar5 = *piVar5 + 1;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&ptr.
                super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  } while( true );
LAB_001f3b01:
  do {
    if ((int)uVar8 < 1) {
      if (t == 0 && local_bc == 0) {
        return OKAY;
      }
      piVar5 = &(this->super_SPxSimplifier<double>).m_remRows;
      *piVar5 = *piVar5 + local_bc;
      piVar5 = &(this->super_SPxSimplifier<double>).m_remCols;
      *piVar5 = *piVar5 + t;
      pSVar7 = (this->super_SPxSimplifier<double>).spxout;
      if (pSVar7 != (SPxOut *)0x0) {
        ptr.super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr._0_4_ = pSVar7->m_verbosity;
        if (3 < (int)(Verbosity)
                     ptr.
                     super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr) {
          ptr2.super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr._0_4_ = 4;
          (*pSVar7->_vptr_SPxOut[2])();
          pSVar7 = soplex::operator<<((this->super_SPxSimplifier<double>).spxout,
                                      "Simplifier (empty rows/colums) removed ");
          pSVar7 = soplex::operator<<(pSVar7,local_bc);
          pSVar7 = soplex::operator<<(pSVar7," rows, ");
          pSVar7 = soplex::operator<<(pSVar7,t);
          pSVar7 = soplex::operator<<(pSVar7," cols");
          std::endl<char,std::char_traits<char>>(pSVar7->m_streams[pSVar7->m_verbosity]);
          pSVar7 = (this->super_SPxSimplifier<double>).spxout;
          (*pSVar7->_vptr_SPxOut[2])(pSVar7,&ptr);
          return OKAY;
        }
        return OKAY;
      }
      return OKAY;
    }
    uVar8 = uVar8 - 1;
  } while ((lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem
           [(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[uVar8].idx].data.
           super_SVectorBase<double>.memused != 0);
  dVar4 = (lp->super_LPColSetBase<double>).object.val.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar8];
  dVar10 = epsZero(this);
  if (dVar4 <= dVar10) {
    dVar4 = (lp->super_LPColSetBase<double>).object.val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar8];
    dVar11 = epsZero(this);
    dVar10 = (lp->super_LPColSetBase<double>).low.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[uVar8];
    pdVar6 = (double *)infinity();
    pVVar9 = pVVar2;
    if (dVar4 < -dVar11) {
      if (dVar10 <= -*pdVar6) {
        return UNBOUNDED;
      }
      goto LAB_001f3c36;
    }
    if (-*pdVar6 < dVar10) goto LAB_001f3c36;
    dVar4 = (pVVar3->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar8];
    pdVar6 = (double *)infinity();
    dVar10 = 0.0;
    pVVar9 = pVVar3;
    if (dVar4 < *pdVar6) goto LAB_001f3c36;
  }
  else {
    dVar4 = (pVVar3->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar8];
    pdVar6 = (double *)infinity();
    pVVar9 = pVVar3;
    if (*pdVar6 <= dVar4) {
      return UNBOUNDED;
    }
LAB_001f3c36:
    dVar10 = (pVVar9->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar8];
  }
  this_02 = (FixBoundsPS *)operator_new(0x30);
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,&psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  FixBoundsPS::FixBoundsPS(this_02,lp,uVar8,dVar10,(shared_ptr<soplex::Tolerances> *)&local_40);
  std::__shared_ptr<soplex::SPxMainSM<double>::PostStep,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<soplex::SPxMainSM<double>::FixBoundsPS,void>
            ((__shared_ptr<soplex::SPxMainSM<double>::PostStep,(__gnu_cxx::_Lock_policy)2> *)&ptr,
             this_02);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  this_03 = (FixVariablePS *)operator_new(0x78);
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_50,&psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  FixVariablePS::FixVariablePS
            (this_03,lp,this,uVar8,dVar10,(shared_ptr<soplex::Tolerances> *)&local_50,true);
  std::__shared_ptr<soplex::SPxMainSM<double>::PostStep,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<soplex::SPxMainSM<double>::FixVariablePS,void>
            ((__shared_ptr<soplex::SPxMainSM<double>::PostStep,(__gnu_cxx::_Lock_policy)2> *)&ptr2,
             this_03);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  std::
  vector<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>_>
  ::push_back(&this_00->data,&ptr);
  std::
  vector<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>_>
  ::push_back(&this_00->data,(value_type *)&ptr2);
  removeCol(this,lp,uVar8);
  t = t + 1;
  piVar5 = (this->m_stat).data + 4;
  *piVar5 = *piVar5 + 1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ptr2.
              super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ptr.
              super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  goto LAB_001f3b01;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::removeEmpty(SPxLPBase<R>& lp)
{

   // This method removes empty rows and columns from the LP.

   int remRows = 0;
   int remCols = 0;

   for(int i = lp.nRows() - 1; i >= 0; --i)
   {
      const SVectorBase<R>& row = lp.rowVector(i);

      if(row.size() == 0)
      {
         SPxOut::debug(this, "IMAISM07 row {}: empty ->", i);

         if(LT(lp.rhs(i), R(0.0), feastol()) || GT(lp.lhs(i), R(0.0), feastol()))
         {
            SPxOut::debug(this, " infeasible lhs={} rhs={}\n", lp.lhs(i), lp.rhs(i));
            return this->INFEASIBLE;
         }

         SPxOut::debug(this, " removed\n");

         std::shared_ptr<PostStep> ptr(new EmptyConstraintPS(lp, i, this->_tolerances));
         m_hist.append(ptr);

         ++remRows;
         removeRow(lp, i);

         ++m_stat[EMPTY_ROW];
      }
   }

   for(int j = lp.nCols() - 1; j >= 0; --j)
   {
      const SVectorBase<R>& col = lp.colVector(j);

      if(col.size() == 0)
      {
         SPxOut::debug(this, "IMAISM08 col {}: empty -> maxObj={} lower={} upper={}", j, lp.maxObj(j),
                       lp.lower(j), lp.upper(j));

         R val;

         if(GT(lp.maxObj(j), R(0.0), this->epsZero()))
         {
            if(lp.upper(j) >= R(infinity))
            {
               SPxOut::debug(this, " unbounded\n");
               return this->UNBOUNDED;
            }

            val = lp.upper(j);
         }
         else if(LT(lp.maxObj(j), R(0.0), this->epsZero()))
         {
            if(lp.lower(j) <= R(-infinity))
            {
               SPxOut::debug(this, " unbounded\n");
               return this->UNBOUNDED;
            }

            val = lp.lower(j);
         }
         else
         {
            SOPLEX_ASSERT_WARN("WMAISM09", isZero(lp.maxObj(j), this->epsZero()));

            // any value within the bounds is ok
            if(lp.lower(j) > R(-infinity))
               val = lp.lower(j);
            else if(lp.upper(j) < R(infinity))
               val = lp.upper(j);
            else
               val = 0.0;
         }

         SPxOut::debug(this, " removed\n");

         std::shared_ptr<PostStep> ptr1(new FixBoundsPS(lp, j, val, this->_tolerances));
         std::shared_ptr<PostStep> ptr2(new FixVariablePS(lp, *this, j, val, this->_tolerances));
         m_hist.append(ptr1);
         m_hist.append(ptr2);

         ++remCols;
         removeCol(lp, j);

         ++m_stat[EMPTY_COL];
      }
   }

   if(remRows + remCols > 0)
   {
      this->m_remRows += remRows;
      this->m_remCols += remCols;

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "Simplifier (empty rows/colums) removed "
                    << remRows << " rows, "
                    << remCols << " cols"
                    << std::endl;)

   }

   return this->OKAY;
}